

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<int,double>(BaseAppender *this,Vector *col,int input)

{
  bool bVar1;
  undefined1 auVar2 [12];
  double result;
  double local_40;
  string local_38;
  
  bVar1 = TryCast::Operation<int,double>(input,&local_40,false);
  if (bVar1) {
    *(double *)(col->data + (this->chunk).count * 8) = local_40;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<int,double>(&local_38,(duckdb *)(ulong)(uint)input,auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}